

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_test_interface.h
# Opt level: O1

void __thiscall
google::
BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::erase(BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
        *this,iterator f,iterator l)

{
  size_type *psVar1;
  sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar2;
  bool bVar3;
  iterator iVar4;
  long lVar5;
  iterator *piVar6;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar7;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_78;
  
  piVar6 = &f;
  psVar7 = &local_78;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    psVar7->ht = piVar6->ht;
    piVar6 = (iterator *)&piVar6->pos;
    psVar7 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)&psVar7->pos;
  }
  do {
    if ((((local_78.pos.row_begin._M_current == l.pos.row_begin._M_current) &&
         (local_78.pos.row_end._M_current == l.pos.row_end._M_current)) &&
        (local_78.pos.row_current._M_current == l.pos.row_current._M_current)) &&
       ((local_78.pos.row_current._M_current == local_78.pos.row_end._M_current ||
        (local_78.pos.col_current == l.pos.col_current)))) {
      (this->ht_).settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      consider_shrink_ = true;
      return;
    }
    bVar3 = sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            ::set_deleted(&this->ht_,&local_78);
    if (bVar3) {
      psVar1 = &(this->ht_).num_deleted;
      *psVar1 = *psVar1 + 1;
    }
    local_78.pos.col_current = local_78.pos.col_current + 1;
    iVar4._M_current = local_78.pos.row_current._M_current;
    if (local_78.pos.col_current ==
        (local_78.pos.row_current._M_current)->group +
        ((local_78.pos.row_current._M_current)->settings).num_buckets) {
      do {
        iVar4._M_current = local_78.pos.row_current._M_current + 1;
        if (iVar4._M_current == local_78.pos.row_end._M_current) break;
        local_78.pos.col_current = (iVar4._M_current)->group;
        psVar2 = local_78.pos.row_current._M_current + 1;
        local_78.pos.row_current._M_current = iVar4._M_current;
      } while ((psVar2->settings).num_buckets == 0);
    }
    local_78.pos.row_current._M_current = iVar4._M_current;
    sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_deleted(&local_78);
  } while( true );
}

Assistant:

void erase(typename HT::iterator f, typename HT::iterator l) {
    ht_.erase(f, l);
  }